

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<kj::_::XThreadEvent_*>::~ArrayBuilder(ArrayBuilder<kj::_::XThreadEvent_*> *this)

{
  XThreadEvent **ppXVar1;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar2;
  XThreadEvent **ppXVar3;
  
  ppXVar1 = this->ptr;
  if (ppXVar1 != (XThreadEvent **)0x0) {
    ppXVar2 = this->pos;
    ppXVar3 = this->endPtr;
    this->ptr = (XThreadEvent **)0x0;
    this->pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    this->endPtr = (XThreadEvent **)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppXVar1,8,(long)ppXVar2 - (long)ppXVar1 >> 3,
               (long)ppXVar3 - (long)ppXVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }